

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::init
          (ConcurrentImageAtomicCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  iterator __position;
  RenderContext *pRVar3;
  Context *pCVar4;
  TestLog *pTVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  undefined4 extraout_var;
  ShaderProgram *pSVar9;
  ostream *poVar10;
  ShaderProgram *extraout_RAX;
  TestError *pTVar11;
  NotSupportedError *this_00;
  char *code;
  long lVar12;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  deUint32 buffer;
  string local_300;
  ScopedLogSection local_2e0;
  value_type local_2d8;
  Context *local_2b8;
  Context local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_290;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  ios_base local_208 [264];
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar7);
  local_278._0_8_ = (ulong)(uint)local_278._4_4_ << 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_290,(long)(this->m_workSize * this->m_workSize),
             (value_type_conflict4 *)local_278,(allocator_type *)local_100);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar6) {
    bVar6 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_OES_shader_image_atomic");
    if (!bVar6) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"Test requires GL_OES_shader_image_atomic","");
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_278);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (**(code **)(lVar12 + 0x6f8))(1,&this->m_imageID);
  (**(code **)(lVar12 + 0xb8))(0xde1,this->m_imageID);
  (**(code **)(lVar12 + 0x1380))(0xde1,1,0x8236,this->m_workSize,this->m_workSize);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar12 + 0x1360))(0xde1,0x2800,0x2600);
  dVar8 = (**(code **)(lVar12 + 0x800))();
  code = (char *)0xa5c;
  glu::checkError(dVar8,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xa5c);
  if (0 < this->m_numCalls) {
    local_2a8.m_contextInfo = (ContextInfo *)&this->m_intermediateResultBuffers;
    iVar7 = 0;
    do {
      local_278._0_8_ = local_278._0_8_ & 0xffffffff00000000;
      (**(code **)(lVar12 + 0x6c8))(1,local_278);
      (**(code **)(lVar12 + 0x40))(0x90d2,local_278._0_8_ & 0xffffffff);
      (**(code **)(lVar12 + 0x150))
                (0x90d2,(long)this->m_workSize * (long)this->m_workSize * 4,
                 local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88ea);
      __position._M_current =
           (this->m_intermediateResultBuffers).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_intermediateResultBuffers).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_2a8.m_contextInfo,
                   __position,(uint *)local_278);
      }
      else {
        *__position._M_current = local_278._0_4_;
        (this->m_intermediateResultBuffers).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      dVar8 = (**(code **)(lVar12 + 0x800))();
      code = (char *)0xa69;
      glu::checkError(dVar8,"gen buffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0xa69);
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->m_numCalls);
  }
  pSVar9 = (ShaderProgram *)operator_new(0xd0);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"${SHADER_IMAGE_ATOMIC_REQUIRE}\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "layout (binding = 1, std430) writeonly buffer IntermediateResults\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\thighp uint values[",0x13);
  poVar10 = (ostream *)std::ostream::operator<<(local_278,this->m_workSize * this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"} sb_ires;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"layout (binding = 2, r32ui) volatile uniform highp uimage2D u_workImage;\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"uniform highp uint u_atomicDelta;\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             "\thighp uint invocationIndex = gl_GlobalInvocationID.x + gl_GlobalInvocationID.y * uint("
             ,0x57);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             "\tsb_ires.values[invocationIndex] = imageAtomicAdd(u_workImage, ivec2(gl_GlobalInvocationID.xy), u_atomicDelta);\n"
             ,0x70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
  pCVar4 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_300,(_anonymous_namespace_ *)pCVar4,local_2b8,code);
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,(ulong)((long)&(local_2a8.m_testCtx)->m_platform + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2e0.m_log._0_4_ = 5;
  paVar1 = &local_2d8.field_2;
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)(uint)local_2e0.m_log * 0x18),&local_2d8);
  glu::ShaderProgram::ShaderProgram(pSVar9,pRVar3,(ProgramSources *)local_100);
  this->m_program = pSVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"could not build program","");
    tcu::TestError::TestError(pTVar11,(string *)local_278);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pSVar9 = (ShaderProgram *)operator_new(0xd0);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout (binding = 1, std430) writeonly buffer ImageValues\n",0x3a
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\thighp uint values[",0x13);
  poVar10 = (ostream *)std::ostream::operator<<(local_278,this->m_workSize * this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"} sb_res;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"layout (binding = 2, r32ui) readonly uniform highp uimage2D u_workImage;\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             "\thighp uint invocationIndex = gl_GlobalInvocationID.x + gl_GlobalInvocationID.y * uint("
             ,0x57);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             "\tsb_res.values[invocationIndex] = imageLoad(u_workImage, ivec2(gl_GlobalInvocationID.xy)).x;\n"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
  pCVar4 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_300,(_anonymous_namespace_ *)pCVar4,local_2b8,code);
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,(ulong)((long)&(local_2a8.m_testCtx)->m_platform + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2e0.m_log._0_4_ = 5;
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)(uint)local_2e0.m_log * 0x18),&local_2d8);
  glu::ShaderProgram::ShaderProgram(pSVar9,pRVar3,(ProgramSources *)local_100);
  this->m_imageReadProgram = pSVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  if ((this->m_imageReadProgram->m_program).m_info.linkOk == false) {
    pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pp_Var2 = (_func_int **)(local_278 + 0x10);
    local_278._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"ImageReadProgram","");
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Image read program","");
    tcu::ScopedLogSection::ScopedLogSection
              (&local_2e0,pTVar5,(string *)local_278,(string *)local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_ !=
        local_f0) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_f0[0]._M_dataplus._M_p + 1));
    }
    if ((_func_int **)local_278._0_8_ != pp_Var2) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_imageReadProgram);
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    local_278._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"could not build program","");
    tcu::TestError::TestError(pTVar11,(string *)local_278);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pSVar9 = (ShaderProgram *)operator_new(0xd0);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "layout (binding = 2, r32ui) writeonly uniform highp uimage2D u_workImage;\n",0x4a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "\timageStore(u_workImage, ivec2(gl_GlobalInvocationID.xy), uvec4(0, 0, 0, 0));\n",0x4e
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}",1);
  pCVar4 = (this->super_TestCase).m_context;
  std::__cxx11::stringbuf::str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_300,(_anonymous_namespace_ *)pCVar4,local_2b8,code);
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,(ulong)((long)&(local_2a8.m_testCtx)->m_platform + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2e0.m_log._0_4_ = 5;
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)(uint)local_2e0.m_log * 0x18),&local_2d8);
  glu::ShaderProgram::ShaderProgram(pSVar9,pRVar3,(ProgramSources *)local_100);
  this->m_imageClearProgram = pSVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  pSVar9 = this->m_imageClearProgram;
  if ((pSVar9->m_program).m_info.linkOk != false) {
    if (local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_290.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_290.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pSVar9 = extraout_RAX;
    }
    return (int)pSVar9;
  }
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pp_Var2 = (_func_int **)(local_278 + 0x10);
  local_278._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"ImageClearProgram","");
  local_100._0_8_ = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Image read program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_2e0,pTVar5,(string *)local_278,(string *)local_100)
  ;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_ !=
      local_f0) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_f0[0]._M_dataplus._M_p + 1));
  }
  if ((_func_int **)local_278._0_8_ != pp_Var2) {
    operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_imageClearProgram);
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  local_278._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"could not build program","");
  tcu::TestError::TestError(pTVar11,(string *)local_278);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConcurrentImageAtomicCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	std::vector<deUint32>	zeroData			(m_workSize * m_workSize, 0);
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic");

	// gen image

	gl.genTextures(1, &m_imageID);
	gl.bindTexture(GL_TEXTURE_2D, m_imageID);
	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_workSize, m_workSize);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

	// gen buffers

	for (int ndx = 0; ndx < m_numCalls; ++ndx)
	{
		deUint32 buffer = 0;

		gl.genBuffers(1, &buffer);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32) * m_workSize * m_workSize, &zeroData[0], GL_DYNAMIC_COPY);

		m_intermediateResultBuffers.push_back(buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");
	}

	// gen programs

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource()));
	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		throw tcu::TestError("could not build program");

	m_imageReadProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genImageReadSource()));
	if (!m_imageReadProgram->isOk())
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ImageReadProgram", "Image read program");

		m_testCtx.getLog() << *m_imageReadProgram;
		throw tcu::TestError("could not build program");
	}

	m_imageClearProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genImageClearSource()));
	if (!m_imageClearProgram->isOk())
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ImageClearProgram", "Image read program");

		m_testCtx.getLog() << *m_imageClearProgram;
		throw tcu::TestError("could not build program");
	}
}